

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ts_parser__breakdown_lookahead
               (TSParser *self,Subtree *lookahead,TSStateId state,ReusableNode *reusable_node)

{
  TSLanguage *language;
  bool bVar1;
  TSStateId TVar2;
  TSSymbol symbol;
  uint32_t uVar3;
  char *pcVar4;
  bool bVar5;
  Subtree local_38;
  Subtree tree;
  _Bool did_descend;
  ReusableNode *reusable_node_local;
  TSStateId state_local;
  Subtree *lookahead_local;
  TSParser *self_local;
  
  bVar1 = false;
  local_38 = reusable_node_tree(reusable_node);
  while( true ) {
    uVar3 = ts_subtree_child_count(local_38);
    bVar5 = false;
    if (uVar3 != 0) {
      TVar2 = ts_subtree_parse_state(local_38);
      bVar5 = TVar2 != state;
    }
    if (!bVar5) break;
    if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
       (self->dot_graph_file != (FILE *)0x0)) {
      language = self->language;
      symbol = ts_subtree_symbol(local_38);
      pcVar4 = ts_language_symbol_name(language,symbol);
      snprintf((self->lexer).debug_buffer,0x400,"state_mismatch sym:%s",pcVar4);
      ts_parser__log(self);
    }
    reusable_node_descend(reusable_node);
    local_38 = reusable_node_tree(reusable_node);
    bVar1 = true;
  }
  if (bVar1) {
    ts_subtree_release(&self->tree_pool,*lookahead);
    *lookahead = local_38;
    ts_subtree_retain(*lookahead);
  }
  return;
}

Assistant:

static void ts_parser__breakdown_lookahead(TSParser *self, Subtree *lookahead,
                                           TSStateId state, ReusableNode *reusable_node) {
  bool did_descend = false;
  Subtree tree = reusable_node_tree(reusable_node);
  while (ts_subtree_child_count(tree) > 0 && ts_subtree_parse_state(tree) != state) {
    LOG("state_mismatch sym:%s", TREE_NAME(tree));
    reusable_node_descend(reusable_node);
    tree = reusable_node_tree(reusable_node);
    did_descend = true;
  }

  if (did_descend) {
    ts_subtree_release(&self->tree_pool, *lookahead);
    *lookahead = tree;
    ts_subtree_retain(*lookahead);
  }
}